

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

StringRef llvm::sys::path::root_path(StringRef path,Style style)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  path *this;
  Style in_R8D;
  bool bVar4;
  bool bVar5;
  StringRef SVar6;
  StringRef path_00;
  undefined1 auStack_98 [8];
  const_iterator b;
  const_iterator pos;
  
  pcVar3 = (char *)path.Length;
  this = (path *)path.Data;
  path_00.Length._0_4_ = style;
  path_00.Data = pcVar3;
  path_00.Length._4_4_ = 0;
  begin((const_iterator *)auStack_98,this,path_00,in_R8D);
  sVar2 = b.Path.Length;
  b._40_8_ = auStack_98;
  if ((auStack_98 != (undefined1  [8])this) || ((char *)b.Component.Length != pcVar3)) {
    if ((b.Component.Data < (char *)0x3) ||
       ((cVar1 = *(char *)b.Path.Length, cVar1 != '/' && (cVar1 != '\\' || style != windows)))) {
      bVar4 = false;
    }
    else {
      bVar4 = *(char *)(b.Path.Length + 1) == cVar1;
    }
    if (b.Component.Data == (char *)0x0 || style != windows) {
      bVar5 = false;
    }
    else {
      bVar5 = b.Component.Data[b.Path.Length - 1] == ':';
    }
    if ((bool)(bVar4 | bVar5)) {
      const_iterator::operator++((const_iterator *)&b.S);
      if (((path *)b._40_8_ != this) || ((char *)b.Component.Length != pcVar3)) {
        if (b.Component.Data == (char *)0x0) goto LAB_00d9a049;
        if (((*(char *)sVar2 == '/') || (*(char *)sVar2 == '\\' && style == windows)) &&
           (b.Component.Data = (char *)((long)b.Component.Data * 2), b.Path.Length = (size_t)this,
           pcVar3 < b.Component.Data)) {
          b.Component.Data = pcVar3;
        }
      }
      goto LAB_00d9a034;
    }
    if (b.Component.Data == (char *)0x0) {
LAB_00d9a049:
      __assert_fail("Index < Length && \"Invalid index!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/StringRef.h"
                    ,0xf9,"char llvm::StringRef::operator[](size_t) const");
    }
    if ((*(char *)b.Path.Length == '/') || (style == windows && *(char *)b.Path.Length == '\\'))
    goto LAB_00d9a034;
  }
  b.Path.Length = (size_t)(path *)0x0;
  b.Component.Data = (char *)0x0;
LAB_00d9a034:
  SVar6.Length = (size_t)b.Component.Data;
  SVar6.Data = (char *)b.Path.Length;
  return SVar6;
}

Assistant:

StringRef root_path(StringRef path, Style style) {
  const_iterator b = begin(path, style), pos = b, e = end(path);
  if (b != e) {
    bool has_net =
        b->size() > 2 && is_separator((*b)[0], style) && (*b)[1] == (*b)[0];
    bool has_drive = (real_style(style) == Style::windows) && b->endswith(":");

    if (has_net || has_drive) {
      if ((++pos != e) && is_separator((*pos)[0], style)) {
        // {C:/,//net/}, so get the first two components.
        return path.substr(0, b->size() + pos->size());
      } else {
        // just {C:,//net}, return the first component.
        return *b;
      }
    }

    // POSIX style root directory.
    if (is_separator((*b)[0], style)) {
      return *b;
    }
  }

  return StringRef();
}